

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_utils.c
# Opt level: O1

void csc2dense(CUPDLPdense *dense,CUPDLPcsc *csc)

{
  uint uVar1;
  cupdlp_int *pcVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  int iVar8;
  
  uVar1 = csc->nRows;
  dense->nRows = uVar1;
  lVar3 = (long)csc->nCols;
  dense->nCols = csc->nCols;
  if (0 < lVar3) {
    lVar5 = 0;
    lVar6 = 0;
    iVar8 = 0;
    do {
      if (0 < (int)uVar1) {
        pcVar2 = csc->colMatIdx;
        uVar7 = 0;
        lVar4 = lVar5;
        do {
          if (uVar7 == (uint)pcVar2[iVar8]) {
            *(cupdlp_float *)((long)dense->data + lVar4) = csc->colMatElem[iVar8];
            iVar8 = iVar8 + 1;
          }
          else {
            *(undefined8 *)((long)dense->data + lVar4) = 0;
          }
          uVar7 = uVar7 + 1;
          lVar4 = lVar4 + lVar3 * 8;
        } while (uVar1 != uVar7);
      }
      lVar6 = lVar6 + 1;
      lVar5 = lVar5 + 8;
    } while (lVar6 != lVar3);
  }
  return;
}

Assistant:

void csc2dense(CUPDLPdense *dense, CUPDLPcsc *csc) {
  dense->nRows = csc->nRows;
  dense->nCols = csc->nCols;

  cupdlp_int iRow = 0;
  cupdlp_int iCol = 0;
  cupdlp_int iMatElem = 0;
  for (iCol = 0; iCol < dense->nCols; ++iCol)
    for (iRow = 0; iRow < dense->nRows; ++iRow) {
      if (iRow == csc->colMatIdx[iMatElem]) {
        dense->data[iRow * dense->nCols + iCol] = csc->colMatElem[iMatElem];
        ++iMatElem;
      } else {
        dense->data[iRow * dense->nCols + iCol] = 0;
      }
    }

  return;
}